

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

ParallelThreadData * __thiscall
JsUtil::BackgroundJobProcessor::GetThreadDataFromCurrentJob(BackgroundJobProcessor *this,Job *job)

{
  ParallelThreadData **ppPVar1;
  Job *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  bVar4 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x35d,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  uVar6 = 0;
  do {
    if (this->threadCount == uVar6) {
      return (ParallelThreadData *)0x0;
    }
    ppPVar1 = this->parallelThreadData + uVar6;
    pJVar2 = (*ppPVar1)->currentJob;
    uVar6 = uVar6 + 1;
  } while (pJVar2 != job || pJVar2 == (Job *)0x0);
  return *ppPVar1;
}

Assistant:

ParallelThreadData * BackgroundJobProcessor::GetThreadDataFromCurrentJob(Job* job)
    {
        Assert(criticalSection.IsLocked());
        ParallelThreadData *currentThreadData = nullptr;
        this->IterateBackgroundThreads([&](ParallelThreadData* threadData)
        {
            if (!threadData->currentJob)
            {
                return false;
            }
            if (threadData->currentJob != job)
            {
                return false;
            }
            currentThreadData = threadData;
            return true;
        }
        );
        return currentThreadData;
    }